

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O0

int archive_compressor_gzip_close(archive_write_filter *f)

{
  private_data_conflict5 *data_00;
  int iVar1;
  int local_2c;
  int local_24;
  int r1;
  int ret;
  private_data_conflict5 *data;
  uchar trailer [8];
  archive_write_filter *f_local;
  
  data_00 = (private_data_conflict5 *)f->data;
  trailer = (uchar  [8])f;
  local_24 = drive_compressor(f,data_00,1);
  if (local_24 == 0) {
    local_24 = __archive_write_filter
                         (*(archive_write_filter **)((long)trailer + 0x10),data_00->compressed,
                          data_00->compressed_buffer_size - (ulong)(data_00->stream).avail_out);
  }
  if (local_24 == 0) {
    data._0_1_ = (undefined1)data_00->crc;
    data._1_1_ = (undefined1)(data_00->crc >> 8);
    data._2_1_ = (undefined1)(data_00->crc >> 0x10);
    data._3_1_ = (undefined1)(data_00->crc >> 0x18);
    data._4_1_ = (undefined1)data_00->total_in;
    data._5_1_ = (undefined1)((ulong)data_00->total_in >> 8);
    data._6_1_ = (undefined1)((ulong)data_00->total_in >> 0x10);
    data._7_1_ = (undefined1)((ulong)data_00->total_in >> 0x18);
    local_24 = __archive_write_filter(*(archive_write_filter **)((long)trailer + 0x10),&data,8);
  }
  iVar1 = cm_zlib_deflateEnd((z_streamp)&data_00->stream);
  if (iVar1 != 0) {
    archive_set_error(*(archive **)((long)trailer + 8),-1,"Failed to clean up compressor");
    local_24 = -0x1e;
  }
  local_2c = __archive_write_close_filter(*(archive_write_filter **)((long)trailer + 0x10));
  if (local_24 <= local_2c) {
    local_2c = local_24;
  }
  return local_2c;
}

Assistant:

static int
archive_compressor_gzip_close(struct archive_write_filter *f)
{
	unsigned char trailer[8];
	struct private_data *data = (struct private_data *)f->data;
	int ret, r1;

	/* Finish compression cycle */
	ret = drive_compressor(f, data, 1);
	if (ret == ARCHIVE_OK) {
		/* Write the last compressed data. */
		ret = __archive_write_filter(f->next_filter,
		    data->compressed,
		    data->compressed_buffer_size - data->stream.avail_out);
	}
	if (ret == ARCHIVE_OK) {
		/* Build and write out 8-byte trailer. */
		trailer[0] = (uint8_t)(data->crc)&0xff;
		trailer[1] = (uint8_t)(data->crc >> 8)&0xff;
		trailer[2] = (uint8_t)(data->crc >> 16)&0xff;
		trailer[3] = (uint8_t)(data->crc >> 24)&0xff;
		trailer[4] = (uint8_t)(data->total_in)&0xff;
		trailer[5] = (uint8_t)(data->total_in >> 8)&0xff;
		trailer[6] = (uint8_t)(data->total_in >> 16)&0xff;
		trailer[7] = (uint8_t)(data->total_in >> 24)&0xff;
		ret = __archive_write_filter(f->next_filter, trailer, 8);
	}

	switch (deflateEnd(&(data->stream))) {
	case Z_OK:
		break;
	default:
		archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
		    "Failed to clean up compressor");
		ret = ARCHIVE_FATAL;
	}
	r1 = __archive_write_close_filter(f->next_filter);
	return (r1 < ret ? r1 : ret);
}